

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestSuite
               (ostream *stream,TestSuite *test_suite)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  pointer ppTVar6;
  int iVar7;
  pointer ppTVar8;
  TimeInMillis ms;
  TimeInMillis ms_00;
  TestInfo *pTVar9;
  uint uVar10;
  long lVar11;
  string kIndent;
  string kTestsuite;
  string local_b8;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"testsuite","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_90,'\x06');
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_b8,'\x04');
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"name","");
  std::__cxx11::string::string((string *)&local_70,(test_suite->name_)._M_dataplus._M_p,&local_91);
  OutputJsonKey(stream,&local_50,&local_b8,&local_70,&local_90,true);
  paVar2 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"tests","");
  ppTVar6 = (test_suite->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar8 = (test_suite->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar6 == ppTVar8) {
    iVar7 = 0;
  }
  else {
    iVar7 = 0;
    do {
      uVar10 = (*ppTVar6)->is_in_another_shard_ ^ 1;
      if ((*ppTVar6)->matches_filter_ == false) {
        uVar10 = 0;
      }
      iVar7 = iVar7 + uVar10;
      ppTVar6 = ppTVar6 + 1;
    } while (ppTVar6 != ppTVar8);
  }
  OutputJsonKey(stream,&local_50,&local_b8,iVar7,&local_90,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (FLAGS_gtest_list_tests == '\0') {
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"failures","");
    iVar7 = TestSuite::failed_test_count(test_suite);
    OutputJsonKey(stream,&local_50,&local_b8,iVar7,&local_90,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"disabled","");
    iVar7 = 0;
    for (ppTVar6 = (test_suite->test_info_list_).
                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppTVar6 !=
        (test_suite->test_info_list_).
        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppTVar6 = ppTVar6 + 1) {
      pTVar9 = *ppTVar6;
      uVar10 = 0;
      if ((pTVar9->matches_filter_ == true) && ((pTVar9->is_in_another_shard_ & 1U) == 0)) {
        uVar10 = (uint)pTVar9->is_disabled_;
      }
      iVar7 = iVar7 + uVar10;
    }
    OutputJsonKey(stream,&local_50,&local_b8,iVar7,&local_90,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"errors","");
    OutputJsonKey(stream,&local_50,&local_b8,0,&local_90,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"timestamp","");
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
              (&local_70,(internal *)test_suite->start_timestamp_,ms);
    OutputJsonKey(stream,&local_50,&local_b8,&local_70,&local_90,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"time","");
    FormatTimeInMillisAsDuration_abi_cxx11_(&local_70,(internal *)test_suite->elapsed_time_,ms_00);
    OutputJsonKey(stream,&local_50,&local_b8,&local_70,&local_90,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    TestPropertiesAsJson(&local_b8,&test_suite->ad_hoc_test_result_,&local_90);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\": [\n",5);
  ppTVar6 = (test_suite->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar8 = (test_suite->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)ppTVar8 - (long)ppTVar6) >> 3) < 1) {
    bVar3 = false;
  }
  else {
    lVar11 = 0;
    bVar3 = false;
    do {
      pTVar9 = ppTVar6[(uint)(test_suite->test_indices_).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar11]];
      if ((pTVar9->matches_filter_ == true) && ((pTVar9->is_in_another_shard_ & 1U) == 0)) {
        bVar4 = true;
        if (bVar3) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
          pTVar9 = (test_suite->test_info_list_).
                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [(uint)(test_suite->test_indices_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar11]];
          bVar4 = bVar3;
        }
        bVar3 = bVar4;
        OutputJsonTestInfo(stream,(test_suite->name_)._M_dataplus._M_p,pTVar9);
        ppTVar6 = (test_suite->test_info_list_).
                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppTVar8 = (test_suite->test_info_list_).
                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)((ulong)((long)ppTVar8 - (long)ppTVar6) >> 3));
  }
  bVar4 = TestResult::Failed(&test_suite->ad_hoc_test_result_);
  if (bVar4) {
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
    }
    OutputJsonTestCaseForTestResult(stream,&test_suite->ad_hoc_test_result_);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]\n",2);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_b8,'\x04');
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestSuite(
    std::ostream* stream, const TestSuite& test_suite) {
  const std::string kTestsuite = "testsuite";
  const std::string kIndent = Indent(6);

  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_suite.name(), kIndent);
  OutputJsonKey(stream, kTestsuite, "tests", test_suite.reportable_test_count(),
                kIndent);
  if (!GTEST_FLAG_GET(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "failures",
                  test_suite.failed_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "disabled",
                  test_suite.reportable_disabled_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "errors", 0, kIndent);
    OutputJsonKey(
        stream, kTestsuite, "timestamp",
        FormatEpochTimeInMillisAsRFC3339(test_suite.start_timestamp()),
        kIndent);
    OutputJsonKey(stream, kTestsuite, "time",
                  FormatTimeInMillisAsDuration(test_suite.elapsed_time()),
                  kIndent, false);
    *stream << TestPropertiesAsJson(test_suite.ad_hoc_test_result(), kIndent)
            << ",\n";
  }

  *stream << kIndent << "\"" << kTestsuite << "\": [\n";

  bool comma = false;
  for (int i = 0; i < test_suite.total_test_count(); ++i) {
    if (test_suite.GetTestInfo(i)->is_reportable()) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      OutputJsonTestInfo(stream, test_suite.name(), *test_suite.GetTestInfo(i));
    }
  }

  // If there was a failure in the test suite setup or teardown include that in
  // the output.
  if (test_suite.ad_hoc_test_result().Failed()) {
    if (comma) {
      *stream << ",\n";
    }
    OutputJsonTestCaseForTestResult(stream, test_suite.ad_hoc_test_result());
  }

  *stream << "\n" << kIndent << "]\n" << Indent(4) << "}";
}